

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaTreeItemPtr_conflict
xmlSchemaParseModelGroup
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,xmlSchemaTypeType type,
          int withParticle)

{
  _xmlAttr *p_Var1;
  xmlSchemaRedefPtr_conflict pxVar2;
  _xmlNode *namespaceName;
  xmlNodePtr pxVar3;
  uint uVar4;
  uint minOccurs;
  int iVar5;
  uint min;
  xmlSchemaParticlePtr item;
  xmlSchemaAnnotPtr pxVar6;
  xmlSchemaTreeItemPtr_conflict pxVar7;
  xmlSchemaTreeItemPtr *ppxVar8;
  xmlSchemaParticlePtr pxVar9;
  xmlSchemaPtr schema_00;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  xmlSchemaBasicItemPtr extraout_RDX_05;
  xmlSchemaBasicItemPtr extraout_RDX_06;
  xmlSchemaBasicItemPtr extraout_RDX_07;
  xmlSchemaBasicItemPtr extraout_RDX_08;
  xmlSchemaBasicItemPtr extraout_RDX_09;
  xmlSchemaBasicItemPtr extraout_RDX_10;
  xmlSchemaBasicItemPtr pxVar10;
  xmlSchemaBasicItemPtr extraout_RDX_11;
  xmlSchemaBasicItemPtr extraout_RDX_12;
  xmlSchemaBasicItemPtr extraout_RDX_13;
  xmlSchemaBasicItemPtr extraout_RDX_14;
  xmlSchemaBasicItemPtr extraout_RDX_15;
  xmlSchemaBasicItemPtr extraout_RDX_16;
  int max;
  _xmlNode *node_00;
  char *message;
  char *in_R9;
  _xmlAttr **pp_Var11;
  _xmlNode *p_Var12;
  xmlSchemaTreeItemPtr_conflict pxVar13;
  xmlSchemaParticlePtr pxVar14;
  xmlNodePtr pxStackY_a0;
  char *in_stack_ffffffffffffff68;
  xmlNodePtr local_90;
  int isElemRef;
  xmlSchemaAnnotPtr local_70;
  xmlChar *local_68;
  uint local_5c;
  xmlSchemaParticlePtr local_58;
  xmlNodePtr local_50;
  uint local_44;
  xmlSchemaPtr local_40;
  xmlSchemaTreeItemPtr_conflict *local_38;
  
  if (node == (xmlNodePtr)0x0) {
    return (xmlSchemaTreeItemPtr_conflict)0x0;
  }
  pxStackY_a0 = node;
  iVar5 = withParticle;
  item = (xmlSchemaParticlePtr)xmlSchemaAddModelGroup(ctxt,schema,type,node);
  if (item != (xmlSchemaParticlePtr)0x0) {
    local_50 = node;
    if (withParticle == 0) {
      local_5c = 1;
      pp_Var11 = &node->properties;
      pxVar10 = extraout_RDX;
      while (p_Var1 = *pp_Var11, p_Var1 != (_xmlAttr *)0x0) {
        if (p_Var1->ns == (xmlNs *)0x0) {
          iVar5 = xmlStrEqual(p_Var1->name,"id");
          pxVar10 = extraout_RDX_02;
          if (iVar5 == 0) goto LAB_0018f943;
        }
        else {
          iVar5 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          pxVar10 = extraout_RDX_00;
          if (iVar5 != 0) {
LAB_0018f943:
            xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var1,pxVar10,(xmlAttrPtr)pxStackY_a0);
            pxVar10 = extraout_RDX_01;
          }
        }
        pp_Var11 = &p_Var1->next;
      }
      minOccurs = 1;
      local_58 = item;
    }
    else {
      if (type != XML_SCHEMA_TYPE_ALL) {
        uVar4 = xmlGetMinOccurs(ctxt,node,-1,0x1d38eb,iVar5,in_R9);
        iVar5 = 0x1d3901;
        max = 0x40000000;
      }
      else {
        max = 1;
        uVar4 = xmlGetMinOccurs(ctxt,node,1,0x1d38e3,iVar5,in_R9);
        iVar5 = 0x1bb69a;
      }
      minOccurs = xmlGetMaxOccurs(ctxt,node,(uint)(type == XML_SCHEMA_TYPE_ALL),max,iVar5,in_R9);
      xmlSchemaPCheckParticleCorrect_2
                (ctxt,(xmlSchemaParticlePtr)node,(xmlNodePtr)(ulong)uVar4,minOccurs,iVar5);
      pxStackY_a0 = (xmlNodePtr)(ulong)minOccurs;
      local_58 = xmlSchemaAddParticle(ctxt,node,uVar4,minOccurs);
      if (local_58 == (xmlSchemaParticlePtr)0x0) {
        return (xmlSchemaTreeItemPtr_conflict)0x0;
      }
      local_58->children = (xmlSchemaTreeItemPtr_conflict)item;
      pp_Var11 = &node->properties;
      pxVar10 = extraout_RDX_03;
      local_5c = uVar4;
      while (p_Var1 = *pp_Var11, p_Var1 != (_xmlAttr *)0x0) {
        if (p_Var1->ns == (xmlNs *)0x0) {
          iVar5 = xmlStrEqual(p_Var1->name,"id");
          pxVar10 = extraout_RDX_06;
          if (((iVar5 == 0) &&
              (iVar5 = xmlStrEqual(p_Var1->name,(xmlChar *)"maxOccurs"), pxVar10 = extraout_RDX_07,
              iVar5 == 0)) &&
             (iVar5 = xmlStrEqual(p_Var1->name,(xmlChar *)"minOccurs"), pxVar10 = extraout_RDX_08,
             iVar5 == 0)) goto LAB_0018fa31;
        }
        else {
          iVar5 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          pxVar10 = extraout_RDX_04;
          if (iVar5 != 0) {
LAB_0018fa31:
            xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var1,pxVar10,(xmlAttrPtr)pxStackY_a0);
            pxVar10 = extraout_RDX_05;
          }
        }
        pp_Var11 = &p_Var1->next;
      }
    }
    pxVar3 = local_50;
    xmlSchemaPValAttrID(ctxt,local_50,(xmlChar *)pxVar10);
    node_00 = pxVar3->children;
    if (node_00 == (xmlNodePtr)0x0) {
      node_00 = (xmlNodePtr)0x0;
    }
    else if (((node_00->ns != (xmlNs *)0x0) &&
             (iVar5 = xmlStrEqual(node_00->name,(xmlChar *)"annotation"), iVar5 != 0)) &&
            (iVar5 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
            iVar5 != 0)) {
      pxVar6 = xmlSchemaParseAnnotation(ctxt,node_00,1);
      item->annot = pxVar6;
      node_00 = node_00->next;
    }
    if (type == XML_SCHEMA_TYPE_ALL) {
      local_90._0_4_ = 0;
      pxVar13 = (xmlSchemaTreeItemPtr_conflict)0x0;
      for (; node_00 != (xmlNodePtr)0x0; node_00 = node_00->next) {
        if (((node_00->ns == (xmlNs *)0x0) ||
            (iVar5 = xmlStrEqual(node_00->name,"element"), iVar5 == 0)) ||
           (iVar5 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar5 == 0)) {
          xmlSchemaPContentErr
                    (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)local_50,node_00,
                     (xmlNodePtr)0x0,"(annotation?, (annotation?, element*)",
                     in_stack_ffffffffffffff68);
          break;
        }
        pxVar7 = (xmlSchemaTreeItemPtr_conflict)
                 xmlSchemaParseElement(ctxt,schema,node_00,&isElemRef,0);
        if (pxVar7 != (xmlSchemaTreeItemPtr_conflict)0x0) {
          local_90._0_4_ = ((int)local_90 + 1) - (uint)(isElemRef == 0);
          if (1 < (int)pxVar7[1].type) {
            xmlSchemaPCustomErr(ctxt,XML_SCHEMAP_COS_ALL_LIMITED,(xmlSchemaBasicItemPtr)0x0,node_00,
                                "Invalid value for minOccurs (must be 0 or 1)",(xmlChar *)0x0);
            pxVar7[1].type = XML_SCHEMA_TYPE_BASIC;
          }
          if (1 < *(int *)&pxVar7[1].field_0x4) {
            xmlSchemaPCustomErr(ctxt,XML_SCHEMAP_COS_ALL_LIMITED,(xmlSchemaBasicItemPtr)0x0,node_00,
                                "Invalid value for maxOccurs (must be 0 or 1)",(xmlChar *)0x0);
            *(undefined4 *)&pxVar7[1].field_0x4 = 1;
          }
          ppxVar8 = &pxVar13->next;
          if (pxVar13 == (xmlSchemaTreeItemPtr_conflict)0x0) {
            ppxVar8 = &item->children;
          }
          *ppxVar8 = pxVar7;
          pxVar13 = pxVar7;
        }
      }
    }
    else {
      local_38 = &item->children;
      local_90 = (xmlNodePtr)0x0;
      pxVar9 = (xmlSchemaParticlePtr)0x0;
      pxVar14 = (xmlSchemaParticlePtr)0x0;
      for (; node_00 != (xmlNodePtr)0x0; node_00 = node_00->next) {
        if ((node_00->ns == (xmlNs *)0x0) ||
           (((iVar5 = xmlStrEqual(node_00->name,"element"), iVar5 == 0 ||
             (iVar5 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
             iVar5 == 0)) &&
            ((node_00->ns == (xmlNs *)0x0 ||
             (((iVar5 = xmlStrEqual(node_00->name,"group"), iVar5 == 0 ||
               (iVar5 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar5 == 0)) &&
              ((node_00->ns == (xmlNs *)0x0 ||
               (((iVar5 = xmlStrEqual(node_00->name,"any"), iVar5 == 0 ||
                 (iVar5 = xmlStrEqual(node_00->ns->href,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar5 == 0))
                && ((node_00->ns == (xmlNs *)0x0 ||
                    (((iVar5 = xmlStrEqual(node_00->name,(xmlChar *)"choice"), iVar5 == 0 ||
                      (iVar5 = xmlStrEqual(node_00->ns->href,
                                           (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                      iVar5 == 0)) &&
                     ((node_00->ns == (xmlNs *)0x0 ||
                      ((iVar5 = xmlStrEqual(node_00->name,(xmlChar *)"sequence"), iVar5 == 0 ||
                       (iVar5 = xmlStrEqual(node_00->ns->href,
                                            (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                       iVar5 == 0)))))))))))))))))))) {
          xmlSchemaPContentErr
                    (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)local_50,node_00,
                     (xmlNodePtr)0x0,"(annotation?, (element | group | choice | sequence | any)*)",
                     in_stack_ffffffffffffff68);
          break;
        }
        if (node_00->ns == (xmlNs *)0x0) {
LAB_0019010f:
          if (pxVar9 == (xmlSchemaParticlePtr)0x0) {
LAB_001901a5:
            pxVar9 = (xmlSchemaParticlePtr)0x0;
          }
          else {
LAB_00190118:
            ppxVar8 = &pxVar14->next;
            if (pxVar14 == (xmlSchemaParticlePtr)0x0) {
              ppxVar8 = local_38;
            }
            *ppxVar8 = (xmlSchemaTreeItemPtr)pxVar9;
            pxVar14 = pxVar9;
          }
        }
        else {
          iVar5 = xmlStrEqual(node_00->name,"element");
          if ((iVar5 != 0) &&
             (iVar5 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
             iVar5 != 0)) {
            pxVar9 = (xmlSchemaParticlePtr)xmlSchemaParseElement(ctxt,schema,node_00,&isElemRef,0);
            pxStackY_a0 = (xmlNodePtr)
                          (ulong)((int)local_90 +
                                 (uint)(isElemRef != 0 && pxVar9 != (xmlSchemaParticlePtr)0x0));
            local_90 = pxStackY_a0;
            goto LAB_0019010f;
          }
          if (node_00->ns == (xmlNs *)0x0) goto LAB_0019010f;
          iVar5 = xmlStrEqual(node_00->name,"group");
          if ((iVar5 != 0) &&
             (iVar5 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
             iVar5 != 0)) {
            pxVar9 = (xmlSchemaParticlePtr)xmlSchemaParseModelGroupDefRef(ctxt,schema,node_00);
            local_90 = (xmlNodePtr)
                       (ulong)(((int)local_90 + 1) - (uint)(pxVar9 == (xmlSchemaParticlePtr)0x0));
            if ((ctxt->isRedefine == 0) ||
               (((pxVar2 = ctxt->redef, pxVar2 == (xmlSchemaRedefPtr_conflict)0x0 ||
                 (pxVar9 == (xmlSchemaParticlePtr)0x0)) ||
                (pxStackY_a0 = (xmlNodePtr)pxVar2->item,
                *(xmlSchemaTypeType *)&pxStackY_a0->_private != XML_SCHEMA_TYPE_GROUP))))
            goto LAB_0019010f;
            pxStackY_a0 = (xmlNodePtr)pxVar9->children;
            if (((pxStackY_a0 != (xmlNodePtr)0x0) &&
                (p_Var12 = (_xmlNode *)pxVar2->refName, pxStackY_a0->children == p_Var12)) &&
               (namespaceName = (_xmlNode *)pxVar2->refTargetNs, pxStackY_a0->last == namespaceName)
               ) {
              if (ctxt->redefCounter == 0) {
                if ((pxVar9->minOccurs != 1) || (pxVar9->maxOccurs != 1)) {
                  local_68 = (xmlChar *)0x0;
                  in_R9 = (char *)xmlSchemaFormatQName
                                            (&local_68,(xmlChar *)namespaceName,(xmlChar *)p_Var12);
                  message = 
                  "The redefining model group definition \'%s\' must not contain a reference to the redefined definition with a maxOccurs/minOccurs other than 1"
                  ;
                  goto LAB_001901e8;
                }
              }
              else {
                local_68 = (xmlChar *)0x0;
                in_R9 = (char *)xmlSchemaFormatQName
                                          (&local_68,(xmlChar *)namespaceName,(xmlChar *)p_Var12);
                message = 
                "The redefining model group definition \'%s\' must not contain more than one reference to the redefined definition"
                ;
LAB_001901e8:
                in_stack_ffffffffffffff68 = (char *)0x0;
                pxStackY_a0 = (xmlNodePtr)0x0;
                xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAP_SRC_REDEFINE,node_00,
                                   (xmlSchemaBasicItemPtr)0x0,message,(xmlChar *)in_R9,
                                   (xmlChar *)0x0);
                if (local_68 != (xmlChar *)0x0) {
                  (*xmlFree)(local_68);
                }
                pxVar9 = (xmlSchemaParticlePtr)0x0;
              }
              ctxt->redef->reference = (xmlSchemaBasicItemPtr)pxVar9;
              ctxt->redefCounter = ctxt->redefCounter + 1;
              goto LAB_0019010f;
            }
            goto LAB_00190118;
          }
          if (node_00->ns == (xmlNs *)0x0) goto LAB_0019010f;
          iVar5 = xmlStrEqual(node_00->name,"any");
          if ((iVar5 == 0) ||
             (iVar5 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
             iVar5 == 0)) {
            if (node_00->ns != (xmlNs *)0x0) {
              iVar5 = xmlStrEqual(node_00->name,(xmlChar *)"choice");
              if ((iVar5 == 0) ||
                 (iVar5 = xmlStrEqual(node_00->ns->href,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar5 == 0)) {
                if ((node_00->ns == (xmlNs *)0x0) ||
                   ((iVar5 = xmlStrEqual(node_00->name,(xmlChar *)"sequence"), iVar5 == 0 ||
                    (iVar5 = xmlStrEqual(node_00->ns->href,
                                         (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar5 == 0)
                    ))) goto LAB_0019010f;
                pxStackY_a0 = (xmlNodePtr)0x6;
              }
              else {
                pxStackY_a0 = (xmlNodePtr)0x7;
              }
              pxVar9 = (xmlSchemaParticlePtr)
                       xmlSchemaParseModelGroup
                                 (ctxt,schema,node_00,(xmlSchemaTypeType)pxStackY_a0,1);
            }
            goto LAB_0019010f;
          }
          pp_Var11 = &node_00->properties;
          pxVar10 = extraout_RDX_09;
          while (p_Var1 = *pp_Var11, p_Var1 != (_xmlAttr *)0x0) {
            if (p_Var1->ns == (xmlNs *)0x0) {
              iVar5 = xmlStrEqual(p_Var1->name,"id");
              pxVar10 = extraout_RDX_12;
              if ((((iVar5 == 0) &&
                   (iVar5 = xmlStrEqual(p_Var1->name,(xmlChar *)"minOccurs"),
                   pxVar10 = extraout_RDX_13, iVar5 == 0)) &&
                  (iVar5 = xmlStrEqual(p_Var1->name,(xmlChar *)"maxOccurs"),
                  pxVar10 = extraout_RDX_14, iVar5 == 0)) &&
                 ((iVar5 = xmlStrEqual(p_Var1->name,"namespace"), pxVar10 = extraout_RDX_15,
                  iVar5 == 0 &&
                  (iVar5 = xmlStrEqual(p_Var1->name,(xmlChar *)"processContents"),
                  pxVar10 = extraout_RDX_16, iVar5 == 0)))) goto LAB_0018ff0e;
            }
            else {
              iVar5 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
              pxVar10 = extraout_RDX_10;
              if (iVar5 != 0) {
LAB_0018ff0e:
                xmlSchemaPIllegalAttrErr
                          (ctxt,(xmlParserErrors)p_Var1,pxVar10,(xmlAttrPtr)pxStackY_a0);
                pxVar10 = extraout_RDX_11;
              }
            }
            pp_Var11 = &p_Var1->next;
          }
          xmlSchemaPValAttrID(ctxt,node_00,(xmlChar *)pxVar10);
          iVar5 = 0x1d3901;
          uVar4 = xmlGetMaxOccurs(ctxt,node_00,0,0x40000000,0x1d3901,in_R9);
          min = xmlGetMinOccurs(ctxt,node_00,-1,0x1d38eb,iVar5,in_R9);
          xmlSchemaPCheckParticleCorrect_2
                    (ctxt,(xmlSchemaParticlePtr)node_00,(xmlNodePtr)(ulong)min,uVar4,iVar5);
          pxStackY_a0 = node_00;
          schema_00 = (xmlSchemaPtr)xmlSchemaAddWildcard(ctxt,schema,XML_SCHEMA_TYPE_ANY,node_00);
          if (schema_00 != (xmlSchemaPtr)0x0) {
            local_44 = uVar4;
            local_40 = schema_00;
            xmlSchemaParseWildcardNs(ctxt,schema_00,(xmlSchemaWildcardPtr)node_00,pxStackY_a0);
            p_Var12 = node_00->children;
            if (p_Var12 == (xmlNodePtr)0x0) {
              local_70 = (xmlSchemaAnnotPtr)0x0;
            }
            else {
              if (((p_Var12->ns == (xmlNs *)0x0) ||
                  (iVar5 = xmlStrEqual(p_Var12->name,(xmlChar *)"annotation"), iVar5 == 0)) ||
                 (iVar5 = xmlStrEqual(p_Var12->ns->href,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar5 == 0)) {
                local_70 = (xmlSchemaAnnotPtr)0x0;
              }
              else {
                local_70 = xmlSchemaParseAnnotation(ctxt,p_Var12,1);
                p_Var12 = p_Var12->next;
                if (p_Var12 == (_xmlNode *)0x0) goto LAB_0019015e;
              }
              in_R9 = "(annotation?)";
              xmlSchemaPContentErr
                        (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node_00,
                         p_Var12,(xmlNodePtr)0x0,"(annotation?)",in_stack_ffffffffffffff68);
            }
LAB_0019015e:
            pxStackY_a0 = (xmlNodePtr)(ulong)local_44;
            if (min == 0 && local_44 == 0) goto LAB_00190169;
            pxVar9 = xmlSchemaAddParticle(ctxt,node_00,min,local_44);
            if (pxVar9 != (xmlSchemaParticlePtr)0x0) {
              pxVar9->annot = local_70;
              pxVar9->children = (xmlSchemaTreeItemPtr_conflict)local_40;
              goto LAB_00190118;
            }
            goto LAB_001901a5;
          }
LAB_00190169:
          pxVar9 = (xmlSchemaParticlePtr)0x0;
        }
      }
    }
    if (minOccurs != 0 || local_5c != 0) {
      if ((int)local_90 == 0) {
        return (xmlSchemaTreeItemPtr_conflict)local_58;
      }
      iVar5 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,item);
      if (iVar5 < 0) {
        xmlSchemaPErrMemory(ctxt);
        return (xmlSchemaTreeItemPtr_conflict)local_58;
      }
      return (xmlSchemaTreeItemPtr_conflict)local_58;
    }
  }
  return (xmlSchemaTreeItemPtr_conflict)0x0;
}

Assistant:

static xmlSchemaTreeItemPtr
xmlSchemaParseModelGroup(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
			 xmlNodePtr node, xmlSchemaTypeType type,
			 int withParticle)
{
    xmlSchemaModelGroupPtr item;
    xmlSchemaParticlePtr particle = NULL;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    int min = 1, max = 1, isElemRef, hasRefs = 0;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);
    /*
    * Create a model group with the given compositor.
    */
    item = xmlSchemaAddModelGroup(ctxt, schema, type, node);
    if (item == NULL)
	return (NULL);

    if (withParticle) {
	if (type == XML_SCHEMA_TYPE_ALL) {
	    min = xmlGetMinOccurs(ctxt, node, 0, 1, 1, "(0 | 1)");
	    max = xmlGetMaxOccurs(ctxt, node, 1, 1, 1, "1");
	} else {
	    /* choice + sequence */
	    min = xmlGetMinOccurs(ctxt, node, 0, -1, 1, "xs:nonNegativeInteger");
	    max = xmlGetMaxOccurs(ctxt, node, 0, UNBOUNDED, 1,
		"(xs:nonNegativeInteger | unbounded)");
	}
	xmlSchemaPCheckParticleCorrect_2(ctxt, NULL, node, min, max);
	/*
	* Create a particle
	*/
	particle = xmlSchemaAddParticle(ctxt, node, min, max);
	if (particle == NULL)
	    return (NULL);
	particle->children = (xmlSchemaTreeItemPtr) item;
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if ((!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "maxOccurs")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "minOccurs"))) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
    } else {
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if (!xmlStrEqual(attr->name, BAD_CAST "id")) {
		    xmlSchemaPIllegalAttrErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
    }

    /*
    * Extract and validate attributes.
    */
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        item->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
        child = child->next;
    }
    if (type == XML_SCHEMA_TYPE_ALL) {
	xmlSchemaParticlePtr part, last = NULL;

	while (IS_SCHEMA(child, "element")) {
	    part = (xmlSchemaParticlePtr) xmlSchemaParseElement(ctxt,
		schema, child, &isElemRef, 0);
	    /*
	    * SPEC cos-all-limited (2)
	    * "The {max occurs} of all the particles in the {particles}
	    * of the ('all') group must be 0 or 1.
	    */
	    if (part != NULL) {
		if (isElemRef)
		    hasRefs++;
		if (part->minOccurs > 1) {
		    xmlSchemaPCustomErr(ctxt,
			XML_SCHEMAP_COS_ALL_LIMITED,
			NULL, child,
			"Invalid value for minOccurs (must be 0 or 1)",
			NULL);
		    /* Reset to 1. */
		    part->minOccurs = 1;
		}
		if (part->maxOccurs > 1) {
		    xmlSchemaPCustomErr(ctxt,
			XML_SCHEMAP_COS_ALL_LIMITED,
			NULL, child,
			"Invalid value for maxOccurs (must be 0 or 1)",
			NULL);
		    /* Reset to 1. */
		    part->maxOccurs = 1;
		}
		if (last == NULL)
		    item->children = (xmlSchemaTreeItemPtr) part;
		else
		    last->next = (xmlSchemaTreeItemPtr) part;
		last = part;
	    }
	    child = child->next;
	}
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL,
		"(annotation?, (annotation?, element*)");
	}
    } else {
	/* choice + sequence */
	xmlSchemaTreeItemPtr part = NULL, last = NULL;

	while ((IS_SCHEMA(child, "element")) ||
	    (IS_SCHEMA(child, "group")) ||
	    (IS_SCHEMA(child, "any")) ||
	    (IS_SCHEMA(child, "choice")) ||
	    (IS_SCHEMA(child, "sequence"))) {

	    if (IS_SCHEMA(child, "element")) {
		part = (xmlSchemaTreeItemPtr)
		    xmlSchemaParseElement(ctxt, schema, child, &isElemRef, 0);
		if (part && isElemRef)
		    hasRefs++;
	    } else if (IS_SCHEMA(child, "group")) {
		part =
		    xmlSchemaParseModelGroupDefRef(ctxt, schema, child);
		if (part != NULL)
		    hasRefs++;
		/*
		* Handle redefinitions.
		*/
		if (ctxt->isRedefine && ctxt->redef &&
		    (ctxt->redef->item->type == XML_SCHEMA_TYPE_GROUP) &&
		    part && part->children)
		{
		    if ((xmlSchemaGetQNameRefName(part->children) ==
			    ctxt->redef->refName) &&
			(xmlSchemaGetQNameRefTargetNs(part->children) ==
			    ctxt->redef->refTargetNs))
		    {
			/*
			* SPEC src-redefine:
			* (6.1) "If it has a <group> among its contents at
			* some level the `actual value` of whose ref
			* [attribute] is the same as the `actual value` of
			* its own name attribute plus target namespace, then
			* all of the following must be true:"
			* (6.1.1) "It must have exactly one such group."
			*/
			if (ctxt->redefCounter != 0) {
			    xmlChar *str = NULL;

			    xmlSchemaCustomErr(ACTXT_CAST ctxt,
				XML_SCHEMAP_SRC_REDEFINE, child, NULL,
				"The redefining model group definition "
				"'%s' must not contain more than one "
				"reference to the redefined definition",
				xmlSchemaFormatQName(&str,
				    ctxt->redef->refTargetNs,
				    ctxt->redef->refName),
				NULL);
			    FREE_AND_NULL(str)
			    part = NULL;
			} else if (((WXS_PARTICLE(part))->minOccurs != 1) ||
			    ((WXS_PARTICLE(part))->maxOccurs != 1))
			{
			    xmlChar *str = NULL;
			    /*
			    * SPEC src-redefine:
			    * (6.1.2) "The `actual value` of both that
			    * group's minOccurs and maxOccurs [attribute]
			    * must be 1 (or `absent`).
			    */
			    xmlSchemaCustomErr(ACTXT_CAST ctxt,
				XML_SCHEMAP_SRC_REDEFINE, child, NULL,
				"The redefining model group definition "
				"'%s' must not contain a reference to the "
				"redefined definition with a "
				"maxOccurs/minOccurs other than 1",
				xmlSchemaFormatQName(&str,
				    ctxt->redef->refTargetNs,
				    ctxt->redef->refName),
				NULL);
			    FREE_AND_NULL(str)
			    part = NULL;
			}
			ctxt->redef->reference = WXS_BASIC_CAST part;
			ctxt->redefCounter++;
		    }
		}
	    } else if (IS_SCHEMA(child, "any")) {
		part = (xmlSchemaTreeItemPtr)
		    xmlSchemaParseAny(ctxt, schema, child);
	    } else if (IS_SCHEMA(child, "choice")) {
		part = xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_CHOICE, 1);
	    } else if (IS_SCHEMA(child, "sequence")) {
		part = xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_SEQUENCE, 1);
	    }
	    if (part != NULL) {
		if (last == NULL)
		    item->children = part;
		else
		    last->next = part;
		last = part;
	    }
	    child = child->next;
	}
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL,
		"(annotation?, (element | group | choice | sequence | any)*)");
	}
    }
    if ((max == 0) && (min == 0))
	return (NULL);
    if (hasRefs) {
	/*
	* We need to resolve references.
	*/
	WXS_ADD_PENDING(ctxt, item);
    }
    if (withParticle)
	return ((xmlSchemaTreeItemPtr) particle);
    else
	return ((xmlSchemaTreeItemPtr) item);
}